

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::add_argument_buffer_padding_buffer_type
          (CompilerMSL *this,SPIRType *struct_type,uint32_t *mbr_idx,uint32_t *arg_buff_index,
          MSLResourceBinding *rez_bind)

{
  TypedID<(spirv_cross::Types)1> local_58;
  Op local_54;
  SPIRType *local_50;
  SPIRType *ptr_type;
  uint32_t ptr_type_id;
  SPIRType *buff_type;
  MSLResourceBinding *pMStack_30;
  uint32_t buff_type_id;
  MSLResourceBinding *rez_bind_local;
  uint32_t *arg_buff_index_local;
  uint32_t *mbr_idx_local;
  SPIRType *struct_type_local;
  CompilerMSL *this_local;
  
  pMStack_30 = rez_bind;
  rez_bind_local = (MSLResourceBinding *)arg_buff_index;
  arg_buff_index_local = mbr_idx;
  mbr_idx_local = (uint32_t *)struct_type;
  struct_type_local = (SPIRType *)this;
  if (this->argument_buffer_padding_buffer_type_id == 0) {
    buff_type._4_4_ = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,2);
    ptr_type._4_4_ = 0;
    _ptr_type_id = Compiler::set<spirv_cross::SPIRType,spv::Op>
                             ((Compiler *)this,buff_type._4_4_,(Op *)((long)&ptr_type + 4));
    _ptr_type_id->basetype = pMStack_30->basetype;
    _ptr_type_id->storage = StorageClassUniformConstant;
    ptr_type._0_4_ = buff_type._4_4_ + 1;
    local_54 = OpTypePointer;
    local_50 = Compiler::set<spirv_cross::SPIRType,spv::Op>
                         ((Compiler *)this,(uint32_t)ptr_type,&local_54);
    SPIRType::operator=(local_50,_ptr_type_id);
    *(undefined4 *)&(local_50->super_IVariant).field_0xc = 0x20;
    local_50->pointer = true;
    local_50->pointer_depth = local_50->pointer_depth + 1;
    TypedID<(spirv_cross::Types)1>::TypedID(&local_58,buff_type._4_4_);
    (local_50->parent_type).id = local_58.id;
    this->argument_buffer_padding_buffer_type_id = (uint32_t)ptr_type;
  }
  add_argument_buffer_padding_type
            (this,this->argument_buffer_padding_buffer_type_id,(SPIRType *)mbr_idx_local,
             arg_buff_index_local,&rez_bind_local->stage,pMStack_30->count);
  return;
}

Assistant:

void CompilerMSL::add_argument_buffer_padding_buffer_type(SPIRType &struct_type, uint32_t &mbr_idx,
                                                          uint32_t &arg_buff_index, MSLResourceBinding &rez_bind)
{
	if (!argument_buffer_padding_buffer_type_id)
	{
		uint32_t buff_type_id = ir.increase_bound_by(2);
		auto &buff_type = set<SPIRType>(buff_type_id, OpNop);
		buff_type.basetype = rez_bind.basetype;
		buff_type.storage = StorageClassUniformConstant;

		uint32_t ptr_type_id = buff_type_id + 1;
		auto &ptr_type = set<SPIRType>(ptr_type_id, OpTypePointer);
		ptr_type = buff_type;
		ptr_type.op = spv::OpTypePointer;
		ptr_type.pointer = true;
		ptr_type.pointer_depth++;
		ptr_type.parent_type = buff_type_id;

		argument_buffer_padding_buffer_type_id = ptr_type_id;
	}

	add_argument_buffer_padding_type(argument_buffer_padding_buffer_type_id, struct_type, mbr_idx, arg_buff_index, rez_bind.count);
}